

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::ProxyEndpoint::Send
          (Error *__return_storage_ptr__,ProxyEndpoint *this,ByteArray *aRequest,
          MessageSubType aSubType)

{
  CoapSecure *this_00;
  bool bVar1;
  int iVar2;
  ErrorCode aErrorCode;
  Error *pEVar3;
  ByteArray *aValue;
  string *__rhs;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  bool local_4c2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  Error local_488;
  ErrorCode local_45c;
  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> local_458;
  ErrorCode local_434;
  Tlv local_430;
  Error local_410;
  ErrorCode local_3e4;
  Tlv local_3e0;
  Error local_3c0;
  ErrorCode local_398;
  allocator local_391;
  string local_390;
  Error local_370;
  uchar *local_348;
  uchar *local_340;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_338;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_330;
  const_iterator local_328;
  anon_class_1_0_00000001 local_31a;
  v10 local_319;
  v10 *local_318;
  size_t local_310;
  string local_308;
  Error local_2e8;
  anon_class_1_0_00000001 local_2ba;
  v10 local_2b9;
  v10 *local_2b8;
  size_t local_2b0;
  string local_2a8;
  Error local_288;
  byte local_259;
  Address local_258;
  Address local_240;
  undefined1 local_228 [8];
  ByteArray udpPayload;
  undefined1 local_200 [8];
  Request udpTx;
  MessageSubType aSubType_local;
  ByteArray *aRequest_local;
  ProxyEndpoint *this_local;
  Error *error;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120;
  size_t sStack_118;
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  v10 **local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  size_t sStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  Error **local_58;
  undefined1 *local_50;
  Error **local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_40;
  Error **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  udpTx.mEndpoint._6_1_ = 0;
  udpTx.mEndpoint._7_1_ = aSubType;
  Error::Error(__return_storage_ptr__);
  coap::Message::Message((Message *)local_200,kNonConfirmable,kPost);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
  local_259 = 0;
  (*(this->super_Endpoint)._vptr_Endpoint[3])(&local_240);
  bVar1 = Address::IsValid(&local_240);
  local_4c2 = false;
  if (bVar1) {
    (*(this->super_Endpoint)._vptr_Endpoint[3])(&local_258);
    local_259 = 1;
    local_4c2 = Address::IsIpv6(&local_258);
  }
  if ((local_259 & 1) != 0) {
    Address::~Address(&local_258);
  }
  Address::~Address(&local_240);
  if (((local_4c2 ^ 0xffU) & 1) == 0) {
    bVar1 = coap::CoapSecure::IsConnected(this->mBrClient);
    if (bVar1) {
      utils::Encode<unsigned_short>((ByteArray *)local_228,0xf0bf);
      iVar2 = (*(this->super_Endpoint)._vptr_Endpoint[4])();
      utils::Encode<unsigned_short>((ByteArray *)local_228,(unsigned_short)iVar2);
      local_330._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_328,&local_330);
      local_338._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(aRequest);
      local_340 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(aRequest)
      ;
      local_348 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                           insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                                     ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                                      local_228,local_328,local_338,
                                      (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       )local_340);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_390,"/c/ut",&local_391);
      coap::Message::SetUriPath(&local_370,(Message *)local_200,&local_390);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_370);
      local_398 = kNone;
      bVar1 = commissioner::operator!=(pEVar3,&local_398);
      Error::~Error(&local_370);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator((allocator<char> *)&local_391);
      if (!bVar1) {
        aValue = Address::GetRaw(&this->mPeerAddr);
        tlv::Tlv::Tlv(&local_3e0,kIpv6Address,aValue,kMeshCoP);
        AppendTlv(&local_3c0,(Message *)local_200,&local_3e0);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_3c0);
        local_3e4 = kNone;
        bVar1 = commissioner::operator!=(pEVar3,&local_3e4);
        Error::~Error(&local_3c0);
        tlv::Tlv::~Tlv(&local_3e0);
        if (!bVar1) {
          tlv::Tlv::Tlv(&local_430,kUdpEncapsulation,(ByteArray *)local_228,kMeshCoP);
          AppendTlv(&local_410,(Message *)local_200,&local_430);
          pEVar3 = Error::operator=(__return_storage_ptr__,&local_410);
          local_434 = kNone;
          bVar1 = commissioner::operator!=(pEVar3,&local_434);
          Error::~Error(&local_410);
          tlv::Tlv::~Tlv(&local_430);
          if (!bVar1) {
            this_00 = this->mBrClient;
            std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
            function(&local_458,(nullptr_t)0x0);
            coap::CoapSecure::SendRequest(this_00,(Request *)local_200,&local_458);
            std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
            ~function(&local_458);
          }
        }
      }
    }
    else {
      Send::anon_class_1_0_00000001::operator()(&local_31a);
      local_a8 = &local_318;
      local_b0 = &local_319;
      bVar4 = ::fmt::v10::operator()(local_b0);
      local_310 = bVar4.size_;
      local_318 = (v10 *)bVar4.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_110 = &local_308;
      local_120 = local_318;
      sStack_118 = local_310;
      local_80 = &local_120;
      local_130 = local_318;
      local_128 = local_310;
      local_78 = local_130;
      sStack_70 = local_128;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_50 = local_140;
      local_58 = &error;
      local_30 = 0;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_58;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_128;
      local_48 = local_58;
      local_38 = local_58;
      local_28 = local_50;
      ::fmt::v10::vformat_abi_cxx11_(&local_308,local_130,fmt_00,args_00);
      Error::Error(&local_2e8,kInvalidState,&local_308);
      Error::operator=(__return_storage_ptr__,&local_2e8);
      Error::~Error(&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
    }
  }
  else {
    Send::anon_class_1_0_00000001::operator()(&local_2ba);
    local_b8 = &local_2b8;
    local_c0 = &local_2b9;
    bVar4 = ::fmt::v10::operator()(local_c0);
    local_2b0 = bVar4.size_;
    local_2b8 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_c8 = &local_2a8;
    local_d8 = local_2b8;
    sStack_d0 = local_2b0;
    local_a0 = &local_d8;
    local_e8 = local_2b8;
    local_e0 = local_2b0;
    local_98 = local_e8;
    sStack_90 = local_e0;
    local_108[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_60 = local_f8;
    local_68 = local_108;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_e0;
    local_40 = local_68;
    local_20 = local_68;
    local_10 = local_60;
    ::fmt::v10::vformat_abi_cxx11_(&local_2a8,local_e8,fmt,args);
    Error::Error(&local_288,kInvalidState,&local_2a8);
    Error::operator=(__return_storage_ptr__,&local_288);
    Error::~Error(&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  local_45c = kNone;
  bVar1 = commissioner::operator!=(__return_storage_ptr__,&local_45c);
  if (bVar1) {
    aErrorCode = Error::GetCode(__return_storage_ptr__);
    __rhs = Error::GetMessage_abi_cxx11_(__return_storage_ptr__);
    std::operator+(&local_4a8,"sending UDP_TX.ntf message failed, ",__rhs);
    Error::Error(&local_488,aErrorCode,&local_4a8);
    Error::operator=(__return_storage_ptr__,&local_488);
    Error::~Error(&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
  }
  udpTx.mEndpoint._6_1_ = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228);
  coap::Message::~Message((Message *)local_200);
  if ((udpTx.mEndpoint._6_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ProxyEndpoint::Send(const ByteArray &aRequest, MessageSubType aSubType)
{
    Error         error;
    coap::Request udpTx{coap::Type::kNonConfirmable, coap::Code::kPost};
    ByteArray     udpPayload;

    (void)aSubType;

    VerifyOrExit(GetPeerAddr().IsValid() && GetPeerAddr().IsIpv6(),
                 error = ERROR_INVALID_STATE("no valid IPv6 peer address"));

    VerifyOrExit(mBrClient.IsConnected(), error = ERROR_INVALID_STATE("not connected to the border agent"));

    // set the source port to default mamagement port for UDP_Tx message
    utils::Encode<uint16_t>(udpPayload, kDefaultMmPort);
    utils::Encode<uint16_t>(udpPayload, GetPeerPort());
    udpPayload.insert(udpPayload.end(), aRequest.begin(), aRequest.end());

    SuccessOrExit(error = udpTx.SetUriPath(uri::kUdpTx));
    SuccessOrExit(error = AppendTlv(udpTx, {tlv::Type::kIpv6Address, mPeerAddr.GetRaw()}));
    SuccessOrExit(error = AppendTlv(udpTx, {tlv::Type::kUdpEncapsulation, udpPayload}));

    mBrClient.SendRequest(udpTx, nullptr);

exit:
    if (error != ErrorCode::kNone)
    {
        error = Error{error.GetCode(), "sending UDP_TX.ntf message failed, " + error.GetMessage()};
    }
    return error;
}